

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-order.c
# Opt level: O3

void check_cb(uv_check_t *handle)

{
  int iVar1;
  uv_prepare_t *handle_00;
  
  iVar1 = uv_check_stop(&check_handle);
  if (iVar1 == 0) {
    iVar1 = uv_timer_stop(&timer_handle);
    if (iVar1 != 0) goto LAB_001746e6;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    if (iVar1 != 0) goto LAB_001746eb;
    iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
    if (iVar1 != 0) goto LAB_001746f0;
    if (prepare_cb_called == '\x01') goto LAB_001746f5;
    if (check_cb_called == '\x01') goto LAB_001746fa;
    if (timer_cb_called != '\x01') {
      check_cb_called = 1;
      return;
    }
  }
  else {
    check_cb_cold_1();
LAB_001746e6:
    check_cb_cold_2();
LAB_001746eb:
    check_cb_cold_3();
LAB_001746f0:
    check_cb_cold_4();
LAB_001746f5:
    check_cb_cold_7();
LAB_001746fa:
    check_cb_cold_6();
  }
  check_cb_cold_5();
  iVar1 = uv_timer_stop(&timer_handle);
  if (iVar1 == 0) {
    if (prepare_cb_called == '\0') goto LAB_0017473e;
    if (check_cb_called == '\0') goto LAB_00174743;
    if (timer_cb_called != '\x01') {
      timer_cb_called = 1;
      return;
    }
  }
  else {
    timer_cb_cold_1();
LAB_0017473e:
    timer_cb_cold_2();
LAB_00174743:
    timer_cb_cold_3();
  }
  timer_cb_cold_4();
  handle_00 = &prepare_handle;
  iVar1 = uv_prepare_stop(&prepare_handle);
  if (iVar1 == 0) {
    if (prepare_cb_called == '\x01') goto LAB_00174787;
    if (check_cb_called != '\0') {
      if (timer_cb_called != '\x01') {
        prepare_cb_called = 1;
        return;
      }
      goto LAB_00174791;
    }
  }
  else {
    prepare_cb_cold_1();
LAB_00174787:
    prepare_cb_cold_4();
  }
  prepare_cb_cold_2();
LAB_00174791:
  prepare_cb_cold_3();
  iVar1 = uv_is_closing((uv_handle_t *)handle_00);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)handle_00,(uv_close_cb)0x0);
  return;
}

Assistant:

static void check_cb(uv_check_t* handle) {
  ASSERT(check_cb_called == 0);
  ASSERT(timer_cb_called == 1);
  ASSERT(close_cb_called == 0);
  uv_close((uv_handle_t*) handle, close_cb);
  uv_close((uv_handle_t*) &timer_handle2, close_cb);
  check_cb_called++;
}